

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_33c8f::ParseDummyNode::configureAttribute
          (ParseDummyNode *this,ConfigureContext *param_1,StringRef name,
          ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> values)

{
  _Alloc_hider _Var1;
  int iVar2;
  long lVar3;
  pair<llvm::StringRef,_llvm::StringRef> *this_00;
  iterator __begin3;
  StringRef local_80;
  string local_70;
  string local_50;
  
  this_00 = values.Data;
  local_80.Length = name.Length;
  local_80.Data = name.Data;
  iVar2 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((char)iVar2 != '\0') {
    llvm::StringRef::str_abi_cxx11_(&local_50,&local_80);
    printf("  -- \'%s\': {\n",local_50._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    for (lVar3 = values.Length << 5; lVar3 != 0; lVar3 = lVar3 + -0x20) {
      llvm::StringRef::str_abi_cxx11_(&local_50,&this_00->first);
      _Var1._M_p = local_50._M_dataplus._M_p;
      llvm::StringRef::str_abi_cxx11_(&local_70,&this_00->second);
      printf("  --   \'%s\': \'%s\'\n",_Var1._M_p,local_70._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      this_00 = this_00 + 1;
    }
    puts("  -- }");
  }
  return true;
}

Assistant:

virtual bool configureAttribute(
      const ConfigureContext&, StringRef name,
      ArrayRef<std::pair<StringRef, StringRef>> values) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': {\n", name.str().c_str());
      for (const auto& value: values) {
        printf("  --   '%s': '%s'\n", value.first.str().c_str(),
               value.second.str().c_str());
      }
      printf("  -- }\n");
    }
    return true;
  }